

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetSystem
                   (XrInstance instance,XrSystemGetInfo *getInfo,XrSystemId *systemId)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  allocator local_461;
  string local_460 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_440;
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3b0;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2f8;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  GenValidUsageXrInstanceInfo *local_290;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrInstance_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSystemId *systemId_local;
  XrSystemGetInfo *getInfo_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  getInfo_local = (XrSystemGetInfo *)instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrInstance_T **)&getInfo_local,&local_4c);
  VVar1 = VerifyXrInstanceHandle((XrInstance *)&getInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pGVar2 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                       (&g_instance_info.
                         super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                        (XrInstance_T *)getInfo_local);
    local_290 = pGVar2;
    if (getInfo == (XrSystemGetInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"VUID-xrGetSystem-getInfo-parameter",&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"xrGetSystem",&local_2d9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_2f8,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_318,
                 "Invalid NULL for XrSystemGetInfo \"getInfo\" which is not optional and must be non-NULL"
                 ,&local_319);
      CoreValidLogMessage(pGVar2,(string *)local_2b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2d8,&local_2f8,(string *)local_318);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_2f8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"xrGetSystem",&local_341);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_340,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,true,true,getInfo);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      pGVar2 = local_290;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if (systemId == (XrSystemId *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3f8,"VUID-xrGetSystem-systemId-parameter",&local_3f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_420,"xrGetSystem",&local_421);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_440,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_460,
                     "Invalid NULL for XrSystemId \"systemId\" which is not optional and must be non-NULL"
                     ,&local_461);
          CoreValidLogMessage(pGVar2,(string *)local_3f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_420,&local_440,(string *)local_460);
          std::__cxx11::string::~string(local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_440);
          std::__cxx11::string::~string(local_420);
          std::allocator<char>::~allocator((allocator<char> *)&local_421);
          std::__cxx11::string::~string(local_3f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          gen_instance_info._4_4_ = 1;
        }
        else {
          instance_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          gen_instance_info._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_368,"VUID-xrGetSystem-getInfo-parameter",&local_369);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,"xrGetSystem",&local_391);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3b0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d0,"Command xrGetSystem param getInfo is invalid",&local_3d1);
        CoreValidLogMessage(pGVar2,(string *)local_368,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_390,&local_3b0,(string *)local_3d0);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3b0);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        std::__cxx11::string::~string(local_368);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
        instance_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        gen_instance_info._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"VUID-xrGetSystem-instance-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrGetSystem",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetSystem(
XrInstance instance,
const XrSystemGetInfo* getInfo,
XrSystemId* systemId) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrGetSystem-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSystem",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSystem-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSystem", objects_info,
                                "Invalid NULL for XrSystemGetInfo \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSystemGetInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetSystem", objects_info,
                                                        true, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSystem-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSystem",
                                objects_info,
                                "Command xrGetSystem param getInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == systemId) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSystem-systemId-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSystem", objects_info,
                                "Invalid NULL for XrSystemId \"systemId\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetSystem-systemId-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}